

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locresdata.cpp
# Opt level: O1

UChar * uloc_getTableStringWithFallback_63
                  (char *path,char *locale,char *tableKey,char *subTableKey,char *itemKey,
                  int32_t *pLength,UErrorCode *pErrorCode)

{
  bool bVar1;
  int iVar2;
  UChar *pUVar3;
  char *pcVar4;
  UChar *us;
  UErrorCode UVar5;
  char *pcVar6;
  char explicitFallbackName [157];
  UResourceBundle subTable;
  UResourceBundle table;
  UErrorCode local_2a0;
  int32_t local_29c;
  UResourceBundle *local_298;
  char *local_290;
  int32_t *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char local_268 [168];
  UResourceBundle local_1c0;
  UResourceBundle local_f8;
  
  local_290 = itemKey;
  memset(local_268,0,0x9d);
  local_2a0 = U_ZERO_ERROR;
  local_298 = ures_open_63(path,locale,&local_2a0);
  if (local_2a0 < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((local_2a0 == U_USING_DEFAULT_WARNING) ||
       ((local_2a0 == U_ERROR_WARNING_START && (*pErrorCode != U_USING_DEFAULT_WARNING)))) {
      *pErrorCode = local_2a0;
    }
    pUVar3 = (UChar *)0x0;
    local_288 = pLength;
    local_280 = tableKey;
    local_278 = path;
    local_270 = locale;
    do {
      ures_initStackObject_63(&local_f8);
      ures_initStackObject_63(&local_1c0);
      ures_getByKeyWithFallback_63(local_298,local_280,&local_f8,&local_2a0);
      if (subTableKey != (char *)0x0) {
        ures_getByKeyWithFallback_63(&local_f8,subTableKey,&local_f8,&local_2a0);
      }
      if (local_2a0 < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar3 = ures_getStringByKeyWithFallback_63(&local_f8,local_290,local_288,&local_2a0);
        pcVar4 = local_280;
        if (local_2a0 < U_ILLEGAL_ARGUMENT_ERROR) break;
        *pErrorCode = local_2a0;
        local_2a0 = U_ZERO_ERROR;
        iVar2 = strcmp(local_280,"Countries");
        pcVar6 = local_290;
        if (iVar2 == 0) {
          pcVar4 = uloc_getCurrentCountryID_63(local_290);
        }
        else {
          iVar2 = strcmp(pcVar4,"Languages");
          pcVar6 = local_290;
          if (iVar2 == 0) {
            pcVar4 = uloc_getCurrentLanguageID_63(local_290);
          }
          else {
            pcVar4 = (char *)0x0;
          }
        }
        bVar1 = true;
        if ((pcVar4 != pcVar6 && pcVar4 != (char *)0x0) &&
           (pUVar3 = ures_getStringByKeyWithFallback_63(&local_f8,pcVar4,local_288,&local_2a0),
           local_2a0 < U_ILLEGAL_ARGUMENT_ERROR)) {
          *pErrorCode = local_2a0;
          bVar1 = false;
        }
        if (!bVar1) break;
      }
      if (local_2a0 < U_ILLEGAL_ARGUMENT_ERROR) break;
      local_29c = 0;
      *pErrorCode = local_2a0;
      local_2a0 = U_ZERO_ERROR;
      us = ures_getStringByKeyWithFallback_63(&local_f8,"Fallback",&local_29c,&local_2a0);
      UVar5 = local_2a0;
      if (local_2a0 < U_ILLEGAL_ARGUMENT_ERROR) {
        u_UCharsToChars_63(us,local_268,local_29c);
        iVar2 = strcmp(local_268,local_270);
        if (iVar2 == 0) {
          UVar5 = U_INTERNAL_PROGRAM_ERROR;
          goto LAB_0028f5e6;
        }
        ures_close_63(local_298);
        local_298 = ures_open_63(local_278,local_268,&local_2a0);
        UVar5 = local_2a0;
        if (U_ZERO_ERROR < local_2a0) goto LAB_0028f5e6;
        bVar1 = true;
      }
      else {
LAB_0028f5e6:
        *pErrorCode = UVar5;
        bVar1 = false;
      }
    } while (bVar1);
    ures_close_63(&local_1c0);
    ures_close_63(&local_f8);
    ures_close_63(local_298);
  }
  else {
    *pErrorCode = local_2a0;
    pUVar3 = (UChar *)0x0;
  }
  return pUVar3;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
uloc_getTableStringWithFallback(const char *path, const char *locale,
                              const char *tableKey, const char *subTableKey,
                              const char *itemKey,
                              int32_t *pLength,
                              UErrorCode *pErrorCode)
{
/*    char localeBuffer[ULOC_FULLNAME_CAPACITY*4];*/
    UResourceBundle *rb=NULL, table, subTable;
    const UChar *item=NULL;
    UErrorCode errorCode;
    char explicitFallbackName[ULOC_FULLNAME_CAPACITY] = {0};

    /*
     * open the bundle for the current locale
     * this falls back through the locale's chain to root
     */
    errorCode=U_ZERO_ERROR;
    rb=ures_open(path, locale, &errorCode);

    if(U_FAILURE(errorCode)) {
        /* total failure, not even root could be opened */
        *pErrorCode=errorCode;
        return NULL;
    } else if(errorCode==U_USING_DEFAULT_WARNING ||
                (errorCode==U_USING_FALLBACK_WARNING && *pErrorCode!=U_USING_DEFAULT_WARNING)
    ) {
        /* set the "strongest" error code (success->fallback->default->failure) */
        *pErrorCode=errorCode;
    }

    for(;;){
        ures_initStackObject(&table);
        ures_initStackObject(&subTable);
        ures_getByKeyWithFallback(rb, tableKey, &table, &errorCode);

        if (subTableKey != NULL) {
            /*
            ures_getByKeyWithFallback(&table,subTableKey, &subTable, &errorCode);
            item = ures_getStringByKeyWithFallback(&subTable, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
            }
            
            break;*/
            
            ures_getByKeyWithFallback(&table,subTableKey, &table, &errorCode);
        }
        if(U_SUCCESS(errorCode)){
            item = ures_getStringByKeyWithFallback(&table, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                const char* replacement = NULL;
                *pErrorCode = errorCode; /*save the errorCode*/
                errorCode = U_ZERO_ERROR;
                /* may be a deprecated code */
                if(uprv_strcmp(tableKey, "Countries")==0){
                    replacement =  uloc_getCurrentCountryID(itemKey);
                }else if(uprv_strcmp(tableKey, "Languages")==0){
                    replacement =  uloc_getCurrentLanguageID(itemKey);
                }
                /*pointer comparison is ok since uloc_getCurrentCountryID & uloc_getCurrentLanguageID return the key itself is replacement is not found*/
                if(replacement!=NULL && itemKey != replacement){
                    item = ures_getStringByKeyWithFallback(&table, replacement, pLength, &errorCode);
                    if(U_SUCCESS(errorCode)){
                        *pErrorCode = errorCode;
                        break;
                    }
                }
            }else{
                break;
            }
        }
        
        if(U_FAILURE(errorCode)){    

            /* still can't figure out ?.. try the fallback mechanism */
            int32_t len = 0;
            const UChar* fallbackLocale =  NULL;
            *pErrorCode = errorCode;
            errorCode = U_ZERO_ERROR;

            fallbackLocale = ures_getStringByKeyWithFallback(&table, "Fallback", &len, &errorCode);
            if(U_FAILURE(errorCode)){
               *pErrorCode = errorCode;
                break;
            }
            
            u_UCharsToChars(fallbackLocale, explicitFallbackName, len);
            
            /* guard against recursive fallback */
            if(uprv_strcmp(explicitFallbackName, locale)==0){
                *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
                break;
            }
            ures_close(rb);
            rb = ures_open(path, explicitFallbackName, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
                break;
            }
            /* succeeded in opening the fallback bundle .. continue and try to fetch the item */
        }else{
            break;
        }
    }
    /* done with the locale string - ready to close table and rb */
    ures_close(&subTable);
    ures_close(&table);
    ures_close(rb);
    return item;
}